

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# customwidgetsinfo.cpp
# Opt level: O1

bool __thiscall
CustomWidgetsInfo::extendsOneOf
          (CustomWidgetsInfo *this,QString *classNameIn,QStringList *baseClassNames)

{
  QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
  *pQVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  char cVar4;
  const_iterator cVar5;
  _Base_ptr *pp_Var6;
  int iVar7;
  byte bVar8;
  byte unaff_R12B;
  long in_FS_OFFSET;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  _Base_ptr local_78;
  _Base_ptr p_Stack_70;
  _Base_ptr local_68;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QVar9.m_data = (classNameIn->d).ptr;
  QVar9.m_size = (classNameIn->d).size;
  cVar4 = QtPrivate::QStringList_contains((QList *)baseClassNames,QVar9,CaseSensitive);
  bVar8 = 1;
  if (cVar4 == '\0') {
    local_58.d.d = (classNameIn->d).d;
    local_58.d.ptr = (classNameIn->d).ptr;
    local_58.d.size = (qsizetype)(classNameIn->d).size;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    do {
      local_78 = (_Base_ptr)0x0;
      pQVar1 = (this->m_customWidgets).d.d.ptr;
      pp_Var6 = &local_78;
      if (pQVar1 != (QMapData<std::map<QString,_DomCustomWidget_*,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>_>
                     *)0x0) {
        cVar5 = std::
                _Rb_tree<QString,_std::pair<const_QString,_DomCustomWidget_*>,_std::_Select1st<std::pair<const_QString,_DomCustomWidget_*>_>,_std::less<QString>,_std::allocator<std::pair<const_QString,_DomCustomWidget_*>_>_>
                ::find(&(pQVar1->m)._M_t,&local_58);
        pp_Var6 = &cVar5._M_node[1]._M_right;
        if ((_Rb_tree_header *)cVar5._M_node ==
            &(((this->m_customWidgets).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) {
          pp_Var6 = &local_78;
        }
      }
      p_Var2 = *pp_Var6;
      if (p_Var2 == (_Base_ptr)0x0) {
        iVar7 = 3;
        bVar8 = unaff_R12B;
      }
      else {
        local_78 = *(_Base_ptr *)(p_Var2 + 1);
        p_Var3 = p_Var2[1]._M_parent;
        p_Var2 = p_Var2[1]._M_left;
        if (local_78 != (_Base_ptr)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&local_78->_M_color)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&local_78->_M_color)->_q_value).super___atomic_base<int>._M_i +
               1;
          UNLOCK();
        }
        p_Stack_70 = p_Var3;
        local_68 = p_Var2;
        if (((_Base_ptr)local_58.d.size == p_Var2) &&
           (QVar11.m_data = local_58.d.ptr, QVar11.m_size = local_58.d.size,
           QVar12.m_data = (storage_type_conflict *)p_Var3, QVar12.m_size = (qsizetype)p_Var2,
           cVar4 = QtPrivate::equalStrings(QVar11,QVar12), cVar4 != '\0')) {
          iVar7 = 1;
          bVar8 = 0;
        }
        else {
          iVar7 = 1;
          QVar10.m_data = (storage_type_conflict *)p_Var3;
          QVar10.m_size = (qsizetype)p_Var2;
          cVar4 = QtPrivate::QStringList_contains((QList *)baseClassNames,QVar10,CaseSensitive);
          bVar8 = 1;
          if (cVar4 == '\0') {
            QString::operator=(&local_58,(QString *)&local_78);
            iVar7 = 0;
            bVar8 = unaff_R12B;
          }
        }
        if (local_78 != (_Base_ptr)0x0) {
          LOCK();
          (((QBasicAtomicInt *)&local_78->_M_color)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)&local_78->_M_color)->_q_value).super___atomic_base<int>._M_i +
               -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)&local_78->_M_color)->_q_value).super___atomic_base<int>._M_i ==
              0) {
            QArrayData::deallocate((QArrayData *)local_78,2,0x10);
          }
        }
      }
      unaff_R12B = bVar8;
    } while (iVar7 == 0);
    if (iVar7 == 3) {
      bVar8 = 0;
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (bool)(bVar8 & 1);
}

Assistant:

bool CustomWidgetsInfo::extendsOneOf(const QString &classNameIn,
                                     const QStringList &baseClassNames) const
{
    if (baseClassNames.contains(classNameIn))
        return true;

    QString className = classNameIn;
    while (const DomCustomWidget *c = customWidget(className)) {
        const QString extends = c->elementExtends();
        if (className == extends) // Faulty legacy custom widget entries exist.
            return false;
        if (baseClassNames.contains(extends))
            return true;
        className = extends;
    }
    return false;
}